

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void jsonObjectStep(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  char c;
  u32 N;
  JsonString *p;
  uchar *z;
  
  p = (JsonString *)sqlite3_aggregate_context(ctx,0x88);
  if (p == (JsonString *)0x0) {
    return;
  }
  if (p->zBuf == (char *)0x0) {
    p->pCtx = ctx;
    p->zBuf = p->zSpace;
    p->nAlloc = 100;
    p->nUsed = 0;
    p->bStatic = '\x01';
    p->eErr = '\0';
    c = '{';
  }
  else {
    c = ',';
    if (p->nUsed < 2) goto LAB_00192a50;
  }
  jsonAppendChar(p,c);
LAB_00192a50:
  p->pCtx = ctx;
  z = sqlite3_value_text(*argv);
  N = sqlite3Strlen30((char *)z);
  jsonAppendString(p,(char *)z,N);
  jsonAppendChar(p,':');
  jsonAppendSqlValue(p,argv[1]);
  return;
}

Assistant:

static void jsonObjectStep(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonString *pStr;
  const char *z;
  u32 n;
  UNUSED_PARAMETER(argc);
  pStr = (JsonString*)sqlite3_aggregate_context(ctx, sizeof(*pStr));
  if( pStr ){
    if( pStr->zBuf==0 ){
      jsonStringInit(pStr, ctx);
      jsonAppendChar(pStr, '{');
    }else if( pStr->nUsed>1 ){
      jsonAppendChar(pStr, ',');
    }
    pStr->pCtx = ctx;
    z = (const char*)sqlite3_value_text(argv[0]);
    n = sqlite3Strlen30(z);
    jsonAppendString(pStr, z, n);
    jsonAppendChar(pStr, ':');
    jsonAppendSqlValue(pStr, argv[1]);
  }
}